

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_MRS_reg(DisasContext_conflict1 *s,arg_MRS_reg *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 local_30;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_MRS_reg *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,9);
  if (iVar1 == 0) {
    if (a->r == 0) {
      local_30 = tcg_temp_new_i32(tcg_ctx_00);
      gen_helper_cpsr_read_aarch64(tcg_ctx_00,local_30,tcg_ctx_00->cpu_env);
    }
    else {
      if (s->user != 0) {
        unallocated_encoding_aarch64(s);
        return true;
      }
      local_30 = load_cpu_offset(tcg_ctx_00,0x158);
    }
    store_reg(s,a->rd,local_30);
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_MRS_reg(DisasContext *s, arg_MRS_reg *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (a->r) {
        if (IS_USER(s)) {
            unallocated_encoding(s);
            return true;
        }
        tmp = load_cpu_field(tcg_ctx, spsr);
    } else {
        tmp = tcg_temp_new_i32(tcg_ctx);
        gen_helper_cpsr_read(tcg_ctx, tmp, tcg_ctx->cpu_env);
    }
    store_reg(s, a->rd, tmp);
    return true;
}